

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O2

string * __thiscall
argparse::Argument::get_usage_full_abi_cxx11_(string *__return_storage_ptr__,Argument *this)

{
  ostream *poVar1;
  allocator<char> local_1c1;
  string metavar;
  stringstream usage;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&usage);
  get_names_csv_abi_cxx11_(&metavar,this,'/');
  std::operator<<(local_190,(string *)&metavar);
  std::__cxx11::string::~string((string *)&metavar);
  if ((this->m_metavar)._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&metavar,"VAR",&local_1c1);
  }
  else {
    std::__cxx11::string::string((string *)&metavar,&this->m_metavar);
  }
  if ((this->m_num_args_range).m_max != 0) {
    poVar1 = std::operator<<(local_190," ");
    std::operator<<(poVar1,(string *)&metavar);
    if (1 < (this->m_num_args_range).m_max) {
      std::operator<<(local_190,"...");
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&metavar);
  std::__cxx11::stringstream::~stringstream((stringstream *)&usage);
  return __return_storage_ptr__;
}

Assistant:

std::string get_usage_full() const {
    std::stringstream usage;

    usage << get_names_csv('/');
    const std::string metavar = !m_metavar.empty() ? m_metavar : "VAR";
    if (m_num_args_range.get_max() > 0) {
      usage << " " << metavar;
      if (m_num_args_range.get_max() > 1) {
        usage << "...";
      }
    }
    return usage.str();
  }